

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O0

uint64_t color_cell_compression_est_mode1
                   (uint32_t num_pixels,color_quad_u8 *pPixels,bc7enc_bool perceptual,
                   uint32_t *pweights,uint64_t best_err_so_far)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  int *in_RCX;
  long lVar8;
  char in_DL;
  long in_RSI;
  uint in_EDI;
  ulong in_R8;
  int db;
  int dg;
  int dr;
  color_quad_u8 *pE1_1;
  uint32_t s_1;
  int d_1;
  color_quad_u8 *pC_2;
  uint32_t i_5;
  int ie;
  int dcb;
  int dcr;
  int dl;
  int cb2;
  int cr2;
  int l2;
  uint32_t s;
  int d;
  color_quad_u8 *pC_1;
  uint32_t i_4;
  color_quad_u8 *pE1;
  int j;
  int cb1 [8];
  int cr1 [8];
  int l1 [8];
  uint64_t total_err;
  uint32_t i_3;
  int thresh [7];
  uint32_t i_2;
  int dots [8];
  int ab;
  int ag;
  int ar;
  uint32_t i_1;
  color_quad_u8 weightedColors [8];
  uint32_t N;
  color_quad_u8 highColor;
  color_quad_u8 lowColor;
  color_quad_u8 *pC;
  uint32_t i;
  uint32_t hb;
  uint32_t hg;
  uint32_t hr;
  uint32_t lb;
  uint32_t lg;
  uint32_t lr;
  uint local_1a0;
  uint local_190;
  uint local_170;
  uint local_15c;
  int local_14c;
  int aiStack_148 [8];
  int aiStack_128 [8];
  int aiStack_108 [8];
  ulong local_e8;
  uint local_dc;
  int local_d8 [7];
  uint local_bc;
  int aiStack_b8 [11];
  uint local_8c;
  uint8_t local_88 [4];
  undefined1 local_84 [24];
  uint8_t local_6c [4];
  color_quad_u8 local_58;
  color_quad_u8 local_54;
  byte *local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  ulong local_28;
  int *local_20;
  char local_11;
  long local_10;
  uint local_4;
  
  local_2c = 0xff;
  local_30 = 0xff;
  local_34 = 0xff;
  local_38 = 0;
  local_3c = 0;
  local_40 = 0;
  for (local_44 = 0; local_44 < in_EDI; local_44 = local_44 + 1) {
    local_50 = (byte *)(in_RSI + (ulong)local_44 * 4);
    if (*local_50 < local_2c) {
      local_2c = (uint)*local_50;
    }
    if (local_50[1] < local_30) {
      local_30 = (uint)local_50[1];
    }
    if (local_50[2] < local_34) {
      local_34 = (uint)local_50[2];
    }
    if (local_38 < *local_50) {
      local_38 = (uint)*local_50;
    }
    if (local_3c < local_50[1]) {
      local_3c = (uint)local_50[1];
    }
    if (local_40 < local_50[2]) {
      local_40 = (uint)local_50[2];
    }
  }
  local_28 = in_R8;
  local_20 = in_RCX;
  local_11 = in_DL;
  local_10 = in_RSI;
  local_4 = in_EDI;
  color_quad_u8_set(&local_54,local_2c,local_30,local_34,0);
  color_quad_u8_set(&local_58,local_38,local_3c,local_40,0);
  local_88[0] = local_54.m_c[0];
  local_88[1] = local_54.m_c[1];
  local_88[2] = local_54.m_c[2];
  local_88[3] = local_54.m_c[3];
  local_6c[0] = local_58.m_c[0];
  local_6c[1] = local_58.m_c[1];
  local_6c[2] = local_58.m_c[2];
  local_6c[3] = local_58.m_c[3];
  local_8c = 1;
  while( true ) {
    if (6 < local_8c) break;
    local_84[(ulong)local_8c * 4 + -4] =
         (char)(((uint)local_54.m_c & 0xff) * (0x40 - g_bc7_weights3[local_8c]) +
                ((uint)local_58.m_c & 0xff) * g_bc7_weights3[local_8c] + 0x20 >> 6);
    local_84[(ulong)local_8c * 4 + -3] =
         (char)((uint)local_54.m_c[1] * (0x40 - g_bc7_weights3[local_8c]) +
                (uint)local_58.m_c[1] * g_bc7_weights3[local_8c] + 0x20 >> 6);
    local_84[(ulong)local_8c * 4 + -2] =
         (char)((uint)local_54.m_c[2] * (0x40 - g_bc7_weights3[local_8c]) +
                (uint)local_58.m_c[2] * g_bc7_weights3[local_8c] + 0x20 >> 6);
    local_8c = local_8c + 1;
  }
  iVar1 = ((uint)local_58.m_c & 0xff) - ((uint)local_54.m_c & 0xff);
  iVar2 = (uint)local_58.m_c[1] - (uint)local_54.m_c[1];
  iVar3 = (uint)local_58.m_c[2] - (uint)local_54.m_c[2];
  for (local_bc = 0; local_bc < 8; local_bc = local_bc + 1) {
    aiStack_b8[local_bc] =
         (uint)(byte)local_84[(ulong)local_bc * 4 + -4] * iVar1 +
         (uint)(byte)local_84[(ulong)local_bc * 4 + -3] * iVar2 +
         (uint)(byte)local_84[(ulong)local_bc * 4 + -2] * iVar3;
  }
  for (local_dc = 0; local_dc < 7; local_dc = local_dc + 1) {
    local_d8[local_dc] = aiStack_b8[local_dc] + aiStack_b8[local_dc + 1] + 1 >> 1;
  }
  local_e8 = 0;
  if (local_11 == '\0') {
    for (local_190 = 0; local_190 < local_4; local_190 = local_190 + 1) {
      pbVar7 = (byte *)(local_10 + (ulong)local_190 * 4);
      iVar4 = iVar1 * (uint)*pbVar7 + iVar2 * (uint)pbVar7[1] + iVar3 * (uint)pbVar7[2];
      if (iVar4 < local_d8[6]) {
        if (iVar4 < local_d8[5]) {
          if (iVar4 < local_d8[4]) {
            if (iVar4 < local_d8[3]) {
              if (iVar4 < local_d8[2]) {
                if (iVar4 < local_d8[1]) {
                  local_1a0 = (uint)(local_d8[0] <= iVar4);
                }
                else {
                  local_1a0 = 2;
                }
              }
              else {
                local_1a0 = 3;
              }
            }
            else {
              local_1a0 = 4;
            }
          }
          else {
            local_1a0 = 5;
          }
        }
        else {
          local_1a0 = 6;
        }
      }
      else {
        local_1a0 = 7;
      }
      lVar8 = (ulong)local_1a0 * 4;
      local_e8 = (*local_20 *
                  ((uint)(byte)local_84[lVar8 + -4] - (uint)*pbVar7) *
                  ((uint)(byte)local_84[lVar8 + -4] - (uint)*pbVar7) +
                  local_20[1] *
                  ((uint)(byte)local_84[lVar8 + -3] - (uint)pbVar7[1]) *
                  ((uint)(byte)local_84[lVar8 + -3] - (uint)pbVar7[1]) +
                 local_20[2] *
                 ((uint)(byte)local_84[lVar8 + -2] - (uint)pbVar7[2]) *
                 ((uint)(byte)local_84[lVar8 + -2] - (uint)pbVar7[2])) + local_e8;
      if (local_28 < local_e8) {
        return local_e8;
      }
    }
  }
  else {
    for (local_14c = 0; local_14c < 8; local_14c = local_14c + 1) {
      lVar8 = (long)local_14c * 4;
      aiStack_108[local_14c] =
           (uint)(byte)local_84[lVar8 + -4] * 0x6d + (uint)(byte)local_84[lVar8 + -3] * 0x16e +
           (uint)(byte)local_84[lVar8 + -2] * 0x25;
      aiStack_128[local_14c] = (uint)(byte)local_84[lVar8 + -4] * 0x200 - aiStack_108[local_14c];
      aiStack_148[local_14c] = (uint)(byte)local_84[lVar8 + -2] * 0x200 - aiStack_108[local_14c];
    }
    for (local_15c = 0; local_15c < local_4; local_15c = local_15c + 1) {
      pbVar7 = (byte *)(local_10 + (ulong)local_15c * 4);
      iVar4 = iVar1 * (uint)*pbVar7 + iVar2 * (uint)pbVar7[1] + iVar3 * (uint)pbVar7[2];
      if (iVar4 < local_d8[6]) {
        if (iVar4 < local_d8[5]) {
          if (iVar4 < local_d8[4]) {
            if (iVar4 < local_d8[3]) {
              if (iVar4 < local_d8[2]) {
                if (iVar4 < local_d8[1]) {
                  local_170 = (uint)(local_d8[0] <= iVar4);
                }
                else {
                  local_170 = 2;
                }
              }
              else {
                local_170 = 3;
              }
            }
            else {
              local_170 = 4;
            }
          }
          else {
            local_170 = 5;
          }
        }
        else {
          local_170 = 6;
        }
      }
      else {
        local_170 = 7;
      }
      iVar4 = (uint)*pbVar7 * 0x6d + (uint)pbVar7[1] * 0x16e + (uint)pbVar7[2] * 0x25;
      iVar5 = aiStack_108[local_170] - iVar4 >> 8;
      iVar6 = (int)(aiStack_128[local_170] - ((uint)*pbVar7 * 0x200 - iVar4)) >> 8;
      iVar4 = (int)(aiStack_148[local_170] - ((uint)pbVar7[2] * 0x200 - iVar4)) >> 8;
      local_e8 = (long)(*local_20 * iVar5 * iVar5 + local_20[1] * iVar6 * iVar6 +
                       local_20[2] * iVar4 * iVar4) + local_e8;
      if (local_28 < local_e8) {
        return local_e8;
      }
    }
  }
  return local_e8;
}

Assistant:

static uint64_t color_cell_compression_est_mode1(uint32_t num_pixels, const color_quad_u8 *pPixels, bc7enc_bool perceptual, uint32_t pweights[4], uint64_t best_err_so_far)
{
	// Find RGB bounds as an approximation of the block's principle axis
	uint32_t lr = 255, lg = 255, lb = 255;
	uint32_t hr = 0, hg = 0, hb = 0;
	for (uint32_t i = 0; i < num_pixels; i++)
	{
		const color_quad_u8 *pC = &pPixels[i];
		if (pC->m_c[0] < lr) lr = pC->m_c[0];
		if (pC->m_c[1] < lg) lg = pC->m_c[1];
		if (pC->m_c[2] < lb) lb = pC->m_c[2];
		if (pC->m_c[0] > hr) hr = pC->m_c[0];
		if (pC->m_c[1] > hg) hg = pC->m_c[1];
		if (pC->m_c[2] > hb) hb = pC->m_c[2];
	}
		
	color_quad_u8 lowColor; color_quad_u8_set(&lowColor, lr, lg, lb, 0);
	color_quad_u8 highColor; color_quad_u8_set(&highColor, hr, hg, hb, 0);

	// Place endpoints at bbox diagonals and compute interpolated colors 
	const uint32_t N = 8;
	color_quad_u8 weightedColors[8];

	weightedColors[0] = lowColor;
	weightedColors[N - 1] = highColor;
	for (uint32_t i = 1; i < (N - 1); i++)
	{
		weightedColors[i].m_c[0] = (uint8_t)((lowColor.m_c[0] * (64 - g_bc7_weights3[i]) + highColor.m_c[0] * g_bc7_weights3[i] + 32) >> 6);
		weightedColors[i].m_c[1] = (uint8_t)((lowColor.m_c[1] * (64 - g_bc7_weights3[i]) + highColor.m_c[1] * g_bc7_weights3[i] + 32) >> 6);
		weightedColors[i].m_c[2] = (uint8_t)((lowColor.m_c[2] * (64 - g_bc7_weights3[i]) + highColor.m_c[2] * g_bc7_weights3[i] + 32) >> 6);
	}

	// Compute dots and thresholds
	const int ar = highColor.m_c[0] - lowColor.m_c[0];
	const int ag = highColor.m_c[1] - lowColor.m_c[1];
	const int ab = highColor.m_c[2] - lowColor.m_c[2];

	int dots[8];
	for (uint32_t i = 0; i < N; i++)
		dots[i] = weightedColors[i].m_c[0] * ar + weightedColors[i].m_c[1] * ag + weightedColors[i].m_c[2] * ab;

	int thresh[8 - 1];
	for (uint32_t i = 0; i < (N - 1); i++)
		thresh[i] = (dots[i] + dots[i + 1] + 1) >> 1;

	uint64_t total_err = 0;
	if (perceptual)
	{
		// Transform block's interpolated colors to YCbCr
		int l1[8], cr1[8], cb1[8];
		for (int j = 0; j < 8; j++)
		{
			const color_quad_u8 *pE1 = &weightedColors[j];
			l1[j] = pE1->m_c[0] * 109 + pE1->m_c[1] * 366 + pE1->m_c[2] * 37;
			cr1[j] = ((int)pE1->m_c[0] << 9) - l1[j];
			cb1[j] = ((int)pE1->m_c[2] << 9) - l1[j];
		}

		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const color_quad_u8 *pC = &pPixels[i];

			int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2];

			// Find approximate selector
			uint32_t s = 0;
			if (d >= thresh[6])
				s = 7;
			else if (d >= thresh[5])
				s = 6;
			else if (d >= thresh[4])
				s = 5;
			else if (d >= thresh[3])
				s = 4;
			else if (d >= thresh[2])
				s = 3;
			else if (d >= thresh[1])
				s = 2;
			else if (d >= thresh[0])
				s = 1;

			// Compute error
			const int l2 = pC->m_c[0] * 109 + pC->m_c[1] * 366 + pC->m_c[2] * 37;
			const int cr2 = ((int)pC->m_c[0] << 9) - l2;
			const int cb2 = ((int)pC->m_c[2] << 9) - l2;

			const int dl = (l1[s] - l2) >> 8;
			const int dcr = (cr1[s] - cr2) >> 8;
			const int dcb = (cb1[s] - cb2) >> 8;

			int ie = (pweights[0] * dl * dl) + (pweights[1] * dcr * dcr) + (pweights[2] * dcb * dcb);

			total_err += ie;
			if (total_err > best_err_so_far)
				break;
		}
	}
	else
	{
		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const color_quad_u8 *pC = &pPixels[i];

			int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2];

			// Find approximate selector
			uint32_t s = 0;
			if (d >= thresh[6])
				s = 7;
			else if (d >= thresh[5])
				s = 6;
			else if (d >= thresh[4])
				s = 5;
			else if (d >= thresh[3])
				s = 4;
			else if (d >= thresh[2])
				s = 3;
			else if (d >= thresh[1])
				s = 2;
			else if (d >= thresh[0])
				s = 1;

			// Compute error
			const color_quad_u8 *pE1 = &weightedColors[s];

			int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
			int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
			int db = (int)pE1->m_c[2] - (int)pC->m_c[2];

			total_err += pweights[0] * (dr * dr) + pweights[1] * (dg * dg) + pweights[2] * (db * db);
			if (total_err > best_err_so_far)
				break;
		}
	}

	return total_err;
}